

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,PreOrPostIncOrDec *p)

{
  int iVar1;
  char *pcVar2;
  char **args;
  char **args_00;
  Type type;
  char *local_88;
  CompileMessage local_80;
  CompileMessage local_48;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(p->target).object);
  iVar1 = (*(((p->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((char)iVar1 == '\0') {
    pcVar2 = "--";
    if (p->isIncrement != false) {
      pcVar2 = "++";
    }
    type._0_8_ = pcVar2;
    Errors::operatorNeedsAssignableTarget<char_const*>(&local_48,(Errors *)&type,args);
    AST::Context::throwError
              (&(p->super_Expression).super_Statement.super_ASTObject.context,&local_48,false);
  }
  (*(((p->target).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&type);
  if (((type.primitiveType.type != bool_) && (type.category < 6)) &&
     ((0x32U >> (type.category & 0x1f) & 1) != 0)) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&type.structure);
    return;
  }
  local_88 = "--";
  if (p->isIncrement != false) {
    local_88 = "++";
  }
  Errors::illegalTypeForOperator<char_const*>(&local_80,(Errors *)&local_88,args_00);
  AST::Context::throwError
            (&(p->super_Expression).super_Statement.super_ASTObject.context,&local_80,false);
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
        {
            super::visit (p);

            auto getOperatorName = [] (const AST::PreOrPostIncOrDec& pp)  { return pp.isIncrement ? "++" : "--"; };

            if (! p.target->isAssignable())
                p.context.throwError (Errors::operatorNeedsAssignableTarget (getOperatorName (p)));

            auto type = p.target->getResultType();

            if (type.isBool() || ! (type.isPrimitive() || type.isBoundedInt()))
                p.context.throwError (Errors::illegalTypeForOperator (getOperatorName (p)));
        }